

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::copyAppend
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,SectionItem *b,SectionItem *e)

{
  qsizetype *pqVar1;
  
  if (b != e) {
    memcpy((this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr +
           (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size,b,(long)e - (long)b
          );
    pqVar1 = &(this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size;
    *pqVar1 = *pqVar1 + ((long)e - (long)b >> 3);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }